

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addVariadicArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,PSNode *arg)

{
  int iVar1;
  op_iterator pUVar2;
  uint idx;
  
  iVar1 = *(int *)(F + 0x60);
  pUVar2 = llvm::CallBase::arg_end((CallBase *)CI);
  for (idx = iVar1 - 1;
      idx < (uint)((ulong)((long)pUVar2 -
                          (long)(CI + (ulong)-(*(uint *)(CI + 0x14) & 0x7ffffff) * 0x20)) >> 5);
      idx = idx + 1) {
    addArgumentOperands(this,CI,arg,idx);
    pUVar2 = llvm::CallBase::arg_end((CallBase *)CI);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addVariadicArgumentOperands(
        const llvm::Function *F, const llvm::CallInst *CI, PSNode *arg) {
    for (unsigned idx = F->arg_size() - 1;
         idx < llvmutils::getNumArgOperands(CI); ++idx)
        addArgumentOperands(CI, arg, idx);
}